

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_gif_in.c
# Opt level: O0

int ReadColorMap(gdIOCtx *fd,int number,uchar (*buffer) [256])

{
  int iVar1;
  uchar local_2f;
  uchar local_2e;
  uchar local_2d;
  int local_2c;
  uchar rgb [3];
  uchar (*pauStack_28) [256];
  int i;
  uchar (*buffer_local) [256];
  int number_local;
  gdIOCtx *fd_local;
  
  local_2c = 0;
  pauStack_28 = buffer;
  while( true ) {
    if (number <= local_2c) {
      return 0;
    }
    iVar1 = gdGetBuf(&local_2f,3,fd);
    if (iVar1 < 1) break;
    (*pauStack_28)[local_2c] = local_2f;
    pauStack_28[1][local_2c] = local_2e;
    pauStack_28[2][local_2c] = local_2d;
    local_2c = local_2c + 1;
  }
  return 1;
}

Assistant:

static int
ReadColorMap(gdIOCtx *fd, int number, unsigned char (*buffer)[256])
{
	int i;
	unsigned char rgb[3];

	for(i = 0; i < number; ++i) {
		if(!ReadOK(fd, rgb, sizeof(rgb))) {
			return TRUE;
		}

		buffer[CM_RED][i] = rgb[0];
		buffer[CM_GREEN][i] = rgb[1];
		buffer[CM_BLUE][i] = rgb[2];
	}

	return FALSE;
}